

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpathedit.cpp
# Opt level: O0

void QPathEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  bool bVar2;
  Style SVar3;
  PathMode PVar4;
  Options OVar5;
  QPathEdit *_t_3;
  QList<QString> local_180;
  QString local_168;
  QString local_150;
  QString local_138;
  Int local_11c;
  QList<QString> *local_118;
  void *_v_1;
  QPathEdit *_t_2;
  QStringList local_f0;
  QString local_d8;
  QString local_c0;
  QString local_a8;
  undefined1 local_88 [16];
  void *_v;
  QPathEdit *_t_1;
  int *result;
  QString local_40;
  QObject *local_28;
  QPathEdit *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (QPathEdit *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      QString::QString(&local_40,(QString *)_a[1]);
      pathChanged((QPathEdit *)_o,&local_40);
      QString::~QString(&local_40);
      break;
    case 1:
      showDialog((QPathEdit *)_o);
      break;
    case 2:
      updateValidInfo((QPathEdit *)_o,(QString *)_a[1]);
      break;
    case 3:
      QString::QString((QString *)&result);
      updateValidInfo((QPathEdit *)_o,(QString *)&result);
      QString::~QString((QString *)&result);
      break;
    case 4:
      editTextUpdate((QPathEdit *)_o);
      break;
    case 5:
      dialogFileSelected((QPathEdit *)_o,(QString *)_a[1]);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == pathChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    local_88._8_8_ = *_a;
    _v = _o;
    switch(_id) {
    case 0:
      SVar3 = style((QPathEdit *)_o);
      *(Style *)&((DataPointer *)local_88._8_8_)->d = SVar3;
      break;
    case 1:
      dialogButtonIcon((QPathEdit *)local_88);
      QIcon::operator=((QIcon *)local_88._8_8_,(QIcon *)local_88);
      QIcon::~QIcon((QIcon *)local_88);
      break;
    case 2:
      PVar4 = pathMode((QPathEdit *)_o);
      *(PathMode *)&((DataPointer *)local_88._8_8_)->d = PVar4;
      break;
    case 3:
      OVar5 = dialogOptions((QPathEdit *)_o);
      *(Int *)&((DataPointer *)local_88._8_8_)->d = OVar5.i;
      break;
    case 4:
      bVar2 = isEditable((QPathEdit *)_o);
      *(bool *)&((DataPointer *)local_88._8_8_)->d = bVar2;
      break;
    case 5:
      bVar2 = isEmptyPathAllowed((QPathEdit *)_o);
      *(bool *)&((DataPointer *)local_88._8_8_)->d = bVar2;
      break;
    case 6:
      bVar2 = useCompleter((QPathEdit *)_o);
      *(bool *)&((DataPointer *)local_88._8_8_)->d = bVar2;
      break;
    case 7:
      defaultDirectory(&local_a8,(QPathEdit *)_o);
      QString::operator=((QString *)local_88._8_8_,&local_a8);
      QString::~QString(&local_a8);
      break;
    case 8:
      path(&local_c0,(QPathEdit *)_o);
      QString::operator=((QString *)local_88._8_8_,&local_c0);
      QString::~QString(&local_c0);
      break;
    case 9:
      placeholder(&local_d8,(QPathEdit *)_o);
      QString::operator=((QString *)local_88._8_8_,&local_d8);
      QString::~QString(&local_d8);
      break;
    case 10:
      nameFilters(&local_f0,(QPathEdit *)_o);
      QList<QString>::operator=((QList<QString> *)local_88._8_8_,&local_f0);
      QList<QString>::~QList(&local_f0);
      break;
    case 0xb:
      mimeTypeFilters((QStringList *)&_t_2,(QPathEdit *)_o);
      QList<QString>::operator=((QList<QString> *)local_88._8_8_,(QList<QString> *)&_t_2);
      QList<QString>::~QList((QList<QString> *)&_t_2);
    }
  }
  else if (_c == WriteProperty) {
    local_118 = (QList<QString> *)*_a;
    _v_1 = _o;
    switch(_id) {
    case 0:
      setStyle((QPathEdit *)_o,*(Style *)&(local_118->d).d,TrailingPosition);
      break;
    case 1:
      setDialogButtonIcon((QPathEdit *)_o,(QIcon *)local_118);
      break;
    case 2:
      setPathMode((QPathEdit *)_o,*(PathMode *)&(local_118->d).d);
      break;
    case 3:
      local_11c = *(Int *)&(local_118->d).d;
      setDialogOptions((QPathEdit *)_o,(Options)local_11c);
      break;
    case 4:
      setEditable((QPathEdit *)_o,(bool)(*(byte *)&(local_118->d).d & 1));
      break;
    case 5:
      setAllowEmptyPath((QPathEdit *)_o,(bool)(*(byte *)&(local_118->d).d & 1));
      break;
    case 6:
      setUseCompleter((QPathEdit *)_o,(bool)(*(byte *)&(local_118->d).d & 1));
      break;
    case 7:
      QString::QString(&local_138,(QString *)local_118);
      setDefaultDirectory((QPathEdit *)_o,&local_138);
      QString::~QString(&local_138);
      break;
    case 8:
      QString::QString(&local_150,(QString *)local_118);
      setPath((QPathEdit *)_o,&local_150,false);
      QString::~QString(&local_150);
      break;
    case 9:
      QString::QString(&local_168,(QString *)local_118);
      setPlaceholder((QPathEdit *)_o,&local_168);
      QString::~QString(&local_168);
      break;
    case 10:
      QList<QString>::QList(&local_180,local_118);
      setNameFilters((QPathEdit *)_o,&local_180);
      QList<QString>::~QList(&local_180);
      break;
    case 0xb:
      QList<QString>::QList((QList<QString> *)&_t_3,local_118);
      setMimeTypeFilters((QPathEdit *)_o,(QList<QString> *)&_t_3);
      QList<QString>::~QList((QList<QString> *)&_t_3);
    }
  }
  else if (_c == ResetProperty) {
    if (_id == 1) {
      resetDialogButtonIcon((QPathEdit *)_o);
    }
    else if (_id == 8) {
      clear((QPathEdit *)_o);
    }
  }
  return;
}

Assistant:

void QPathEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->pathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->showDialog(); break;
        case 2: _t->updateValidInfo((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->updateValidInfo(); break;
        case 4: _t->editTextUpdate(); break;
        case 5: _t->dialogFileSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QPathEdit::*)(QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QPathEdit::pathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Style*>(_v) = _t->style(); break;
        case 1: *reinterpret_cast< QIcon*>(_v) = _t->dialogButtonIcon(); break;
        case 2: *reinterpret_cast< PathMode*>(_v) = _t->pathMode(); break;
        case 3: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->dialogOptions(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->isEditable(); break;
        case 5: *reinterpret_cast< bool*>(_v) = _t->isEmptyPathAllowed(); break;
        case 6: *reinterpret_cast< bool*>(_v) = _t->useCompleter(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->defaultDirectory(); break;
        case 8: *reinterpret_cast< QString*>(_v) = _t->path(); break;
        case 9: *reinterpret_cast< QString*>(_v) = _t->placeholder(); break;
        case 10: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 11: *reinterpret_cast< QStringList*>(_v) = _t->mimeTypeFilters(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setStyle(*reinterpret_cast< Style*>(_v)); break;
        case 1: _t->setDialogButtonIcon(*reinterpret_cast< QIcon*>(_v)); break;
        case 2: _t->setPathMode(*reinterpret_cast< PathMode*>(_v)); break;
        case 3: _t->setDialogOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        case 4: _t->setEditable(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setAllowEmptyPath(*reinterpret_cast< bool*>(_v)); break;
        case 6: _t->setUseCompleter(*reinterpret_cast< bool*>(_v)); break;
        case 7: _t->setDefaultDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 8: _t->setPath(*reinterpret_cast< QString*>(_v)); break;
        case 9: _t->setPlaceholder(*reinterpret_cast< QString*>(_v)); break;
        case 10: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 11: _t->setMimeTypeFilters(*reinterpret_cast< QStringList*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 1: _t->resetDialogButtonIcon(); break;
        case 8: _t->clear(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}